

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

bool wasm::DataFlow::allInputsIdentical(Node *node)

{
  Id IVar1;
  Node *this;
  bool bVar2;
  bool bVar3;
  pointer ppNVar4;
  pointer ppNVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (node->type == Phi) {
    ppNVar4 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)((long)(node->values).
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >> 3)) {
      ppNVar5 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar3 = (ulong)((long)(node->values).
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar5) < 0x11;
      if (bVar3) {
        return bVar3;
      }
      this = ppNVar4[1];
      uVar7 = 2;
      uVar8 = 3;
      while (uVar7 < (ulong)((long)(node->values).
                                   super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar5 >> 3))
      {
        bVar3 = Node::operator==(this,ppNVar5[uVar7]);
        if (!bVar3) {
          return false;
        }
        ppNVar5 = (node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(node->values).
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar5 >> 3;
        bVar3 = uVar7 <= uVar8;
        bVar2 = uVar7 <= uVar8;
        uVar7 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
        if (bVar2) {
          return bVar3;
        }
      }
      goto LAB_0083709a;
    }
  }
  else {
    if (node->type != Expr) {
      return false;
    }
    IVar1 = ((node->field_1).expr)->_id;
    if (IVar1 == SelectId) {
      ppNVar4 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4;
      if (1 < (ulong)(lVar6 >> 3)) {
        if (lVar6 != 0x10) {
          ppNVar5 = ppNVar4 + 1;
          ppNVar4 = ppNVar4 + 2;
          goto LAB_0083707e;
        }
        uVar7 = 2;
        goto LAB_0083709a;
      }
    }
    else {
      if (IVar1 != BinaryId) {
        return false;
      }
      ppNVar5 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppNVar4 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppNVar4 == ppNVar5) {
        uVar7 = 0;
        goto LAB_0083709a;
      }
      if (1 < (ulong)((long)ppNVar4 - (long)ppNVar5 >> 3)) {
        ppNVar4 = ppNVar5 + 1;
LAB_0083707e:
        bVar3 = Node::operator==(*ppNVar5,*ppNVar4);
        return bVar3;
      }
    }
  }
  uVar7 = 1;
LAB_0083709a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

inline bool allInputsIdentical(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Binary>()) {
        return *(node->getValue(0)) == *(node->getValue(1));
      } else if (node->expr->is<Select>()) {
        return *(node->getValue(1)) == *(node->getValue(2));
      }
      break;
    }
    case Node::Type::Phi: {
      auto* first = node->getValue(1);
      // Check if any of the others are not equal
      for (Index i = 2; i < node->values.size(); i++) {
        auto* curr = node->getValue(i);
        if (*first != *curr) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}